

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O0

void av1_collect_neighbors_ref_counts(MACROBLOCKD *xd)

{
  byte bVar1;
  MB_MODE_INFO *mbmi;
  int iVar2;
  long lVar3;
  long in_RDI;
  int left_in_image;
  int above_in_image;
  MB_MODE_INFO *left_mbmi;
  MB_MODE_INFO *above_mbmi;
  uint8_t *ref_counts;
  MB_MODE_INFO *mbmi_00;
  
  memset((void *)(in_RDI + 0x298a),0,8);
  lVar3 = in_RDI + 0x298a;
  mbmi = *(MB_MODE_INFO **)(in_RDI + 0x1ed0);
  mbmi_00 = *(MB_MODE_INFO **)(in_RDI + 0x1ec8);
  bVar1 = *(byte *)(in_RDI + 0x1ec1);
  if (((*(byte *)(in_RDI + 0x1ec0) & 1) != 0) && (iVar2 = is_inter_block(mbmi_00), iVar2 != 0)) {
    *(char *)(lVar3 + mbmi->ref_frame[0]) = *(char *)(lVar3 + mbmi->ref_frame[0]) + '\x01';
    iVar2 = has_second_ref(mbmi);
    if (iVar2 != 0) {
      *(char *)(lVar3 + mbmi->ref_frame[1]) = *(char *)(lVar3 + mbmi->ref_frame[1]) + '\x01';
    }
  }
  if (((bVar1 & 1) != 0) && (iVar2 = is_inter_block(mbmi_00), iVar2 != 0)) {
    *(char *)(lVar3 + mbmi_00->ref_frame[0]) = *(char *)(lVar3 + mbmi_00->ref_frame[0]) + '\x01';
    iVar2 = has_second_ref(mbmi_00);
    if (iVar2 != 0) {
      *(char *)(lVar3 + mbmi_00->ref_frame[1]) = *(char *)(lVar3 + mbmi_00->ref_frame[1]) + '\x01';
    }
  }
  return;
}

Assistant:

static inline void av1_collect_neighbors_ref_counts(MACROBLOCKD *const xd) {
  av1_zero(xd->neighbors_ref_counts);

  uint8_t *const ref_counts = xd->neighbors_ref_counts;

  const MB_MODE_INFO *const above_mbmi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mbmi = xd->left_mbmi;
  const int above_in_image = xd->up_available;
  const int left_in_image = xd->left_available;

  // Above neighbor
  if (above_in_image && is_inter_block(above_mbmi)) {
    ref_counts[above_mbmi->ref_frame[0]]++;
    if (has_second_ref(above_mbmi)) {
      ref_counts[above_mbmi->ref_frame[1]]++;
    }
  }

  // Left neighbor
  if (left_in_image && is_inter_block(left_mbmi)) {
    ref_counts[left_mbmi->ref_frame[0]]++;
    if (has_second_ref(left_mbmi)) {
      ref_counts[left_mbmi->ref_frame[1]]++;
    }
  }
}